

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed.c++
# Opt level: O2

void __thiscall capnp::_::PackedInputStream::skip(PackedInputStream *this,size_t bytes)

{
  uchar *puVar1;
  int iVar2;
  size_t sVar3;
  byte *pbVar4;
  uchar *puVar5;
  uint uVar6;
  byte bVar7;
  bool bVar8;
  ArrayPtr<const_unsigned_char> AVar9;
  Fault f;
  Fault local_30;
  
  if (bytes == 0) {
    return;
  }
LAB_00245ef9:
  AVar9 = kj::BufferedInputStream::getReadBuffer(this->inner);
  pbVar4 = AVar9.ptr;
LAB_00245f05:
  do {
    if ((ulong)((long)(AVar9.ptr + AVar9.size_) - (long)pbVar4) < 10) {
      if (AVar9.ptr + AVar9.size_ == pbVar4) {
        (*(this->inner->super_InputStream)._vptr_InputStream[3])(this->inner,AVar9.size_);
        AVar9 = kj::BufferedInputStream::getReadBuffer(this->inner);
        pbVar4 = AVar9.ptr;
        if (AVar9.size_ == 0) {
          iVar2 = 0xce;
LAB_002460c5:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                    (&local_30,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                     ,iVar2,FAILED,"buffer.size() > 0","\"Premature end of packed input.\"",
                     (char (*) [31])"Premature end of packed input.");
          goto LAB_002460cc;
        }
        goto LAB_00245f05;
      }
      bVar7 = *pbVar4;
      pbVar4 = pbVar4 + 1;
      uVar6 = 0;
      while( true ) {
        sVar3 = AVar9.size_;
        if (uVar6 == 8) break;
        if ((bVar7 >> (uVar6 & 0x1f) & 1) != 0) {
          if (AVar9.ptr + sVar3 == pbVar4) {
            (*(this->inner->super_InputStream)._vptr_InputStream[3])(this->inner,sVar3);
            AVar9 = kj::BufferedInputStream::getReadBuffer(this->inner);
            pbVar4 = AVar9.ptr;
            if (AVar9.size_ == 0) {
              iVar2 = 0xda;
              goto LAB_002460c5;
            }
          }
          pbVar4 = pbVar4 + 1;
        }
        uVar6 = uVar6 + 1;
      }
      if ((AVar9.ptr + sVar3 == pbVar4) && ((byte)(bVar7 + 1) < 2)) {
        (*(this->inner->super_InputStream)._vptr_InputStream[3])(this->inner,sVar3);
        AVar9 = kj::BufferedInputStream::getReadBuffer(this->inner);
        pbVar4 = AVar9.ptr;
        if (AVar9.size_ == 0) {
          iVar2 = 0xe2;
          goto LAB_002460c5;
        }
      }
    }
    else {
      bVar7 = *pbVar4;
      pbVar4 = pbVar4 + (ulong)(bVar7 >> 7) +
                        (ulong)((bVar7 >> 6 & 1) != 0) +
                        (ulong)(bVar7 >> 5 & 1) +
                        (ulong)((bVar7 >> 4 & 1) != 0) +
                        (ulong)(bVar7 >> 3 & 1) +
                        (ulong)((bVar7 >> 2 & 1) != 0) +
                        (ulong)(bVar7 >> 1 & 1) + (ulong)(bVar7 & 1) + 1;
    }
    bytes = bytes + -8;
    if (bVar7 == 0xff) {
      puVar1 = (uchar *)((ulong)*pbVar4 * 8);
      bVar8 = bytes < puVar1;
      bytes = bytes + (ulong)*pbVar4 * -8;
      if (bVar8) {
        iVar2 = 0x107;
LAB_0024616c:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[56]>
                  (&local_30,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                   ,iVar2,FAILED,"runLength <= bytes",
                   "\"Packed input did not end cleanly on a segment boundary.\"",
                   (char (*) [56])"Packed input did not end cleanly on a segment boundary.");
LAB_002460cc:
        kj::_::Debug::Fault::~Fault(&local_30);
        return;
      }
      puVar5 = AVar9.ptr + (AVar9.size_ - (long)(pbVar4 + 1));
      if (puVar5 <= puVar1) break;
      pbVar4 = pbVar4 + 1 + (long)puVar1;
    }
    else if (bVar7 == 0) {
      bVar8 = bytes < (uchar *)((ulong)*pbVar4 * 8);
      bytes = bytes + (ulong)*pbVar4 * -8;
      if (bVar8) {
        iVar2 = 0xfc;
        goto LAB_0024616c;
      }
      pbVar4 = pbVar4 + 1;
    }
    if ((uchar *)bytes == (uchar *)0x0) {
      (*(this->inner->super_InputStream)._vptr_InputStream[3])
                (this->inner,(long)pbVar4 - (long)AVar9.ptr);
      return;
    }
  } while( true );
  (*(this->inner->super_InputStream)._vptr_InputStream[3])
            (this->inner,(ulong)(uint)((int)puVar1 - (int)puVar5) + AVar9.size_);
  if ((uchar *)bytes == (uchar *)0x0) {
    return;
  }
  goto LAB_00245ef9;
}

Assistant:

void PackedInputStream::skip(size_t bytes) {
  // We can't just read into buffers because buffers must end on block boundaries.

  if (bytes == 0) {
    return;
  }

  KJ_DREQUIRE(bytes % sizeof(word) == 0, "PackedInputStream reads must be word-aligned.");

  kj::ArrayPtr<const byte> buffer = inner.getReadBuffer();
  const uint8_t* __restrict__ in = reinterpret_cast<const uint8_t*>(buffer.begin());

#define REFRESH_BUFFER() \
  inner.skip(buffer.size()); \
  buffer = inner.getReadBuffer(); \
  KJ_REQUIRE(buffer.size() > 0, "Premature end of packed input.") { return; } \
  in = reinterpret_cast<const uint8_t*>(buffer.begin())

  for (;;) {
    uint8_t tag;

    if (BUFFER_REMAINING < 10) {
      if (BUFFER_REMAINING == 0) {
        REFRESH_BUFFER();
        continue;
      }

      // We have at least 1, but not 10, bytes available.  We need to read slowly, doing a bounds
      // check on each byte.

      tag = *in++;

      for (uint i = 0; i < 8; i++) {
        if (tag & (1u << i)) {
          if (BUFFER_REMAINING == 0) {
            REFRESH_BUFFER();
          }
          in++;
        }
      }
      bytes -= 8;

      if (BUFFER_REMAINING == 0 && (tag == 0 || tag == 0xffu)) {
        REFRESH_BUFFER();
      }
    } else {
      tag = *in++;

#define HANDLE_BYTE(n) \
      in += (tag & (1u << n)) != 0

      HANDLE_BYTE(0);
      HANDLE_BYTE(1);
      HANDLE_BYTE(2);
      HANDLE_BYTE(3);
      HANDLE_BYTE(4);
      HANDLE_BYTE(5);
      HANDLE_BYTE(6);
      HANDLE_BYTE(7);
#undef HANDLE_BYTE

      bytes -= 8;
    }

    if (tag == 0) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= bytes, "Packed input did not end cleanly on a segment boundary.") {
        return;
      }

      bytes -= runLength;

    } else if (tag == 0xffu) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= bytes, "Packed input did not end cleanly on a segment boundary.") {
        return;
      }

      bytes -= runLength;

      size_t inRemaining = BUFFER_REMAINING;
      if (inRemaining > runLength) {
        // Fast path.
        in += runLength;
      } else {
        // Forward skip to the underlying stream.
        runLength -= inRemaining;
        inner.skip(buffer.size() + runLength);

        if (bytes == 0) {
          return;
        } else {
          buffer = inner.getReadBuffer();
          in = reinterpret_cast<const uint8_t*>(buffer.begin());

          // Skip the bounds check below since we just did the same check above.
          continue;
        }
      }
    }

    if (bytes == 0) {
      inner.skip(in - reinterpret_cast<const uint8_t*>(buffer.begin()));
      return;
    }
  }

  KJ_FAIL_ASSERT("Can't get here.");
}